

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_multiplyv3(quaternion *self,vector3 *vT)

{
  undefined1 local_28 [8];
  quaternion r;
  vector3 *vT_local;
  quaternion *self_local;
  
  local_28._0_4_ =
       -(self->field_0).q[2] * (vT->field_0).v[1] +
       (self->field_0).q[3] * (vT->field_0).v[0] + (self->field_0).q[1] * (vT->field_0).v[2];
  local_28._4_4_ =
       (self->field_0).q[2] * (vT->field_0).v[0] +
       (self->field_0).q[3] * (vT->field_0).v[1] + -((self->field_0).q[0] * (vT->field_0).v[2]);
  r.field_0.q[0] =
       -(self->field_0).q[1] * (vT->field_0).v[0] +
       (self->field_0).q[3] * (vT->field_0).v[2] + (self->field_0).q[0] * (vT->field_0).v[1];
  r.field_0.q[1] =
       -(self->field_0).q[2] * (vT->field_0).v[2] +
       (self->field_0).q[0] * (vT->field_0).v[0] + -((self->field_0).q[1] * (vT->field_0).v[1]);
  r.field_0._8_8_ = vT;
  quaternion_set(self,(quaternion *)local_28);
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_multiplyv3(struct quaternion *self, const struct vector3 *vT)
{
	/* vT is the multiplicand */

	struct quaternion r;

	r.x = self->w * vT->x + self->y * vT->z - self->z * vT->y;
	r.y = self->w * vT->y - self->x * vT->z + self->z * vT->x;
	r.z = self->w * vT->z + self->x * vT->y - self->y * vT->x;
	r.w = self->x * vT->x - self->y * vT->y - self->z * vT->z;

	quaternion_set(self, &r); /* overwrite/save it */

	return self;
}